

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

int CBB_add_asn1_element(CBB *cbb,CBS_ASN1_TAG tag,uint8_t *data,size_t data_len)

{
  int iVar1;
  CBB child;
  
  iVar1 = CBB_add_asn1(cbb,&child,tag);
  if (((iVar1 != 0) && (iVar1 = CBB_add_bytes(&child,data,data_len), iVar1 != 0)) &&
     (iVar1 = CBB_flush(cbb), iVar1 != 0)) {
    return 1;
  }
  cbb_on_error(cbb);
  return 0;
}

Assistant:

int CBB_add_asn1_element(CBB *cbb, CBS_ASN1_TAG tag, const uint8_t *data,
                         size_t data_len) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, tag) ||
      !CBB_add_bytes(&child, data, data_len) ||  //
      !CBB_flush(cbb)) {
    cbb_on_error(cbb);
    return 0;
  }

  return 1;
}